

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Tags::Tag::Clear(Tag *this)

{
  SimpleTag *pSVar1;
  long *in_RDI;
  SimpleTag *d;
  SimpleTag *local_28;
  SimpleTag *in_stack_ffffffffffffffe0;
  SimpleTag *pSVar2;
  
  while (0 < *(int *)((long)in_RDI + 0xc)) {
    *(int *)((long)in_RDI + 0xc) = *(int *)((long)in_RDI + 0xc) + -1;
    SimpleTag::Clear(in_stack_ffffffffffffffe0);
  }
  pSVar2 = (SimpleTag *)*in_RDI;
  if (pSVar2 != (SimpleTag *)0x0) {
    pSVar1 = pSVar2 + -1;
    local_28 = pSVar2 + (long)pSVar2[-1].m_tag_string;
    if (pSVar2 != local_28) {
      do {
        local_28 = local_28 + -1;
        SimpleTag::~SimpleTag(local_28);
      } while (local_28 != pSVar2);
    }
    operator_delete__(&pSVar1->m_tag_string);
  }
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 1) = 0;
  return;
}

Assistant:

void Tags::Tag::Clear() {
  while (m_simple_tags_count > 0) {
    SimpleTag& d = m_simple_tags[--m_simple_tags_count];
    d.Clear();
  }

  delete[] m_simple_tags;
  m_simple_tags = NULL;

  m_simple_tags_size = 0;
}